

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
          (SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *this,InState *Elt)

{
  uint uVar1;
  
  if ((this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).
      super_SmallVectorBase.Size) {
    SmallVectorTemplateBase<llvm::yaml::Output::InState,true>::push_back(this);
  }
  *(InState *)
   ((long)(this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).
          super_SmallVectorBase.BeginX +
   (ulong)(this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).
          super_SmallVectorBase.Size * 4) = *Elt;
  uVar1 = (this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).
          super_SmallVectorBase.Size;
  if (uVar1 < (this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>).super_SmallVectorBase
    .Size = uVar1 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }